

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters_tests.c
# Opt level: O0

void can_create_markers_for_mixed_parameters(void)

{
  byte bVar1;
  int actual;
  undefined8 uVar2;
  byte *pbVar3;
  ulong uVar4;
  undefined8 uVar5;
  CgreenVector *markers;
  char *in_stack_ffffffffffffffd0;
  undefined8 in_stack_ffffffffffffffd8;
  int line;
  char *in_stack_ffffffffffffffe0;
  
  line = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  uVar2 = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
  actual = cgreen_vector_size(uVar2);
  create_equal_to_value_constraint(5,"5");
  cgreen::assert_that_<int>
            (in_stack_ffffffffffffffe0,line,in_stack_ffffffffffffffd0,actual,(Constraint *)0x1157a3)
  ;
  pbVar3 = (byte *)cgreen_vector_get(uVar2,0);
  uVar4 = (ulong)((*pbVar3 ^ 0xff) & 1);
  uVar5 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x94,"!*(bool*)cgreen_vector_get(markers, 0)",uVar4,uVar5);
  pbVar3 = (byte *)cgreen_vector_get(uVar2,1);
  uVar4 = (ulong)(*pbVar3 & 1);
  uVar5 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x95,"*(bool*)cgreen_vector_get(markers, 1)",uVar4,uVar5);
  pbVar3 = (byte *)cgreen_vector_get(uVar2,2);
  uVar4 = (ulong)((*pbVar3 ^ 0xff) & 1);
  uVar5 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x96,"!*(bool*)cgreen_vector_get(markers, 2)",uVar4,uVar5);
  pbVar3 = (byte *)cgreen_vector_get(uVar2,3);
  bVar1 = *pbVar3;
  uVar5 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x97,"!*(bool*)cgreen_vector_get(markers, 3)",(bVar1 ^ 0xff) & 1,uVar5);
  pbVar3 = (byte *)cgreen_vector_get(uVar2,4);
  bVar1 = *pbVar3;
  uVar5 = create_is_true_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/parameters_tests.c"
               ,0x98,"*(bool*)cgreen_vector_get(markers, 4)",bVar1 & 1,uVar5);
  destroy_cgreen_vector(uVar2);
  return;
}

Assistant:

Ensure(can_create_markers_for_mixed_parameters) {
    CgreenVector *markers = create_vector_of_double_markers_for("a, box_double(b), c,d,box_double(e)");
    assert_that(cgreen_vector_size(markers), is_equal_to(5));
    assert_that(!*(bool*)cgreen_vector_get(markers, 0));
    assert_that(*(bool*)cgreen_vector_get(markers, 1));
    assert_that(!*(bool*)cgreen_vector_get(markers, 2));
    assert_that(!*(bool*)cgreen_vector_get(markers, 3));
    assert_that(*(bool*)cgreen_vector_get(markers, 4));
    destroy_cgreen_vector(markers);
}